

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2.c
# Opt level: O0

void ssh2_handle_winadj_response(ssh2_channel *c,PktIn *pktin,void *ctx)

{
  uint *sizep;
  void *ctx_local;
  PktIn *pktin_local;
  ssh2_channel *c_local;
  
  c->remlocwin = *ctx + c->remlocwin;
  safefree(ctx);
  if (c->throttle_state == UNTHROTTLING) {
    c->throttle_state = UNTHROTTLED;
  }
  return;
}

Assistant:

static void ssh2_handle_winadj_response(struct ssh2_channel *c,
                                        PktIn *pktin, void *ctx)
{
    unsigned *sizep = ctx;

    /*
     * Winadj responses should always be failures. However, at least
     * one server ("boks_sshd") is known to return SUCCESS for channel
     * requests it's never heard of, such as "winadj@putty". Raised
     * with foxt.com as bug 090916-090424, but for the sake of a quiet
     * life, we don't worry about what kind of response we got.
     */

    c->remlocwin += *sizep;
    sfree(sizep);
    /*
     * winadj messages are only sent when the window is fully open, so
     * if we get an ack of one, we know any pending unthrottle is
     * complete.
     */
    if (c->throttle_state == UNTHROTTLING)
        c->throttle_state = UNTHROTTLED;
}